

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winsock.cpp
# Opt level: O2

string * fs_hostname_abi_cxx11_(void)

{
  string_view s;
  int iVar1;
  size_t sVar2;
  string *in_RDI;
  string_view path;
  string_view fname;
  size_t sStack_38;
  string name;
  
  sVar2 = fs_get_max_path();
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct((ulong)&name,(char)sVar2);
  iVar1 = gethostname(name._M_dataplus._M_p,name._M_string_length);
  if (iVar1 == 0) {
    s._M_str = name._M_dataplus._M_p;
    s._M_len = sStack_38;
    fs_trim_abi_cxx11_(s);
  }
  else {
    path._M_str = name._M_dataplus._M_p;
    path._M_len = name._M_string_length;
    fname._M_str = "fs_hostname";
    fname._M_len = 0xb;
    fs_print_error(path,fname);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&name);
  return in_RDI;
}

Assistant:

std::string fs_hostname()
{
  std::string name(fs_get_max_path(), '\0');
  int ret = -1;

#if defined(_WIN32)
  if(WSADATA wsaData; !WSAStartup(MAKEWORD(2, 0), &wsaData)){
    ret = gethostname(name.data(), static_cast<int>(name.size()));
    WSACleanup();
  }

#else
  ret = gethostname(name.data(), name.size());
#endif

  if (ret == 0)
    return fs_trim(name);

  fs_print_error(name, __func__);
  return {};
}